

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_free_window(nk_context *ctx,nk_window *win)

{
  nk_window *win_00;
  nk_page_element *pnVar1;
  nk_table *pnVar2;
  nk_page_element *pnVar3;
  nk_page_element *pe;
  nk_page_element *elem;
  
  win_00 = (win->popup).win;
  elem = (nk_page_element *)win->tables;
  if (win_00 != (nk_window *)0x0) {
    nk_free_window(ctx,win_00);
    (win->popup).win = (nk_window *)0x0;
  }
  win->next = (nk_window *)0x0;
  win->prev = (nk_window *)0x0;
  if (elem != (nk_page_element *)0x0) {
    pnVar3 = (nk_page_element *)win->tables;
    do {
      pnVar1 = (nk_page_element *)(elem->data).tbl.next;
      if (pnVar3 == elem) {
        win->tables = (nk_table *)pnVar1;
      }
      pnVar2 = (elem->data).tbl.prev;
      if (pnVar1 != (nk_page_element *)0x0) {
        (pnVar1->data).tbl.prev = pnVar2;
      }
      if (pnVar2 != (nk_table *)0x0) {
        pnVar2->next = (nk_table *)pnVar1;
      }
      (elem->data).tbl.next = (nk_table *)0x0;
      (elem->data).tbl.prev = (nk_table *)0x0;
      nk_free_page_element(ctx,elem);
      pnVar3 = (nk_page_element *)win->tables;
      if (elem == (nk_page_element *)win->tables) {
        win->tables = (nk_table *)pnVar1;
        pnVar3 = pnVar1;
      }
      elem = pnVar1;
    } while (pnVar1 != (nk_page_element *)0x0);
  }
  nk_free_page_element(ctx,(nk_page_element *)win);
  return;
}

Assistant:

NK_INTERN void
nk_free_window(struct nk_context *ctx, struct nk_window *win)
{
    /* unlink windows from list */
    struct nk_table *n, *it = win->tables;
    if (win->popup.win) {
        nk_free_window(ctx, win->popup.win);
        win->popup.win = 0;
    }
    win->next = 0;
    win->prev = 0;

    while (it) {
        /*free window state tables */
        n = it->next;
        nk_remove_table(win, it);
        nk_free_table(ctx, it);
        if (it == win->tables)
            win->tables = n;
        it = n;
    }

    /* link windows into freelist */
    {union nk_page_data *pd = NK_CONTAINER_OF(win, union nk_page_data, win);
    struct nk_page_element *pe = NK_CONTAINER_OF(pd, struct nk_page_element, data);
    nk_free_page_element(ctx, pe);}
}